

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O1

string * __thiscall
(anonymous_namespace)::gtest_CAV1FwdTxfm2d_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *info)

{
  bool bVar1;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> info_00;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *extraout_RDX_00;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *extraout_RDX_01;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *extraout_RDX_02;
  ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> PVar2;
  testing local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  __normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_double,_double>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>_>
  local_30;
  __normal_iterator<const_std::tuple<unsigned_char,_unsigned_char,_double,_double>_*,_std::vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>_>
  local_28;
  
  bVar1 = testing::internal::AlwaysTrue();
  info_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  if (!bVar1) {
    anon_unknown.dwarf_1d734c9::GetTxfm2dParamList();
    PVar2 = testing::
            ValuesIn<__gnu_cxx::__normal_iterator<std::tuple<unsigned_char,unsigned_char,double,double>const*,std::vector<std::tuple<unsigned_char,unsigned_char,double,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,double,double>>>>>
                      (local_40,local_30,local_28);
    info_00._M_pi =
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_38->_M_use_count = local_38->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_38->_M_use_count = local_38->_M_use_count + 1;
      }
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      info_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    }
    if (local_30._M_current != (tuple<unsigned_char,_unsigned_char,_double,_double> *)0x0) {
      operator_delete(local_30._M_current);
      info_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      info_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
    }
  }
  testing::internal::DefaultParamName<std::tuple<unsigned_char,unsigned_char,double,double>>
            (__return_storage_ptr__,(internal *)this,
             (TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *)
             info_00._M_pi);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }